

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

void duckdb::TernaryExecutor::
     ExecuteGeneric<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t,duckdb::TernaryLambdaWrapper,duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t,duckdb::date_t)>
               (Vector *a,Vector *b,Vector *c,Vector *result,idx_t count,
               _func_date_t_interval_t_date_t_date_t *fun)

{
  unsigned_long *puVar1;
  date_t *result_data;
  int32_t *piVar2;
  date_t dVar3;
  UnifiedVectorFormat cdata;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  
  if (((a->vector_type == CONSTANT_VECTOR) && (b->vector_type == CONSTANT_VECTOR)) &&
     (c->vector_type == CONSTANT_VECTOR)) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar1 = (a->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) ||
        ((puVar1 = (b->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
         puVar1 != (unsigned_long *)0x0 && ((*puVar1 & 1) == 0)))) ||
       ((puVar1 = (c->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar1 != (unsigned_long *)0x0 && ((*puVar1 & 1) == 0)))) {
      ConstantVector::SetNull(result,true);
      return;
    }
    piVar2 = (int32_t *)result->data;
    dVar3 = (*fun)(*(interval_t *)a->data,*(int32_t *)b->data,*(int32_t *)c->data);
    *piVar2 = dVar3.days;
  }
  else {
    Vector::SetVectorType(result,FLAT_VECTOR);
    UnifiedVectorFormat::UnifiedVectorFormat(&adata);
    UnifiedVectorFormat::UnifiedVectorFormat(&bdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&cdata);
    Vector::ToUnifiedFormat(a,count,&adata);
    Vector::ToUnifiedFormat(b,count,&bdata);
    Vector::ToUnifiedFormat(c,count,&cdata);
    result_data = (date_t *)result->data;
    FlatVector::VerifyFlatVector(result);
    ExecuteLoop<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t,duckdb::TernaryLambdaWrapper,duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t,duckdb::date_t)>
              ((interval_t *)adata.data,(date_t *)bdata.data,(date_t *)cdata.data,result_data,count,
               adata.sel,bdata.sel,cdata.sel,&adata.validity,&bdata.validity,&cdata.validity,
               &result->validity,fun);
    UnifiedVectorFormat::~UnifiedVectorFormat(&cdata);
    UnifiedVectorFormat::~UnifiedVectorFormat(&bdata);
    UnifiedVectorFormat::~UnifiedVectorFormat(&adata);
  }
  return;
}

Assistant:

static void ExecuteGeneric(Vector &a, Vector &b, Vector &c, Vector &result, idx_t count, FUN fun) {
		if (a.GetVectorType() == VectorType::CONSTANT_VECTOR && b.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    c.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			if (ConstantVector::IsNull(a) || ConstantVector::IsNull(b) || ConstantVector::IsNull(c)) {
				ConstantVector::SetNull(result, true);
			} else {
				auto adata = ConstantVector::GetData<A_TYPE>(a);
				auto bdata = ConstantVector::GetData<B_TYPE>(b);
				auto cdata = ConstantVector::GetData<C_TYPE>(c);
				auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
				auto &result_validity = ConstantVector::Validity(result);
				result_data[0] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
				    fun, adata[0], bdata[0], cdata[0], result_validity, 0);
			}
		} else {
			result.SetVectorType(VectorType::FLAT_VECTOR);

			UnifiedVectorFormat adata, bdata, cdata;
			a.ToUnifiedFormat(count, adata);
			b.ToUnifiedFormat(count, bdata);
			c.ToUnifiedFormat(count, cdata);

			ExecuteLoop<A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE, OPWRAPPER>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), FlatVector::GetData<RESULT_TYPE>(result), count,
			    *adata.sel, *bdata.sel, *cdata.sel, adata.validity, bdata.validity, cdata.validity,
			    FlatVector::Validity(result), fun);
		}
	}